

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::encode
          (AnnotatedEnumHandler *this,JsonCodec *codec,DynamicEnum input,Builder output)

{
  StringPtr *pSVar1;
  char *pcVar2;
  ulong uVar3;
  Reader value;
  Fault local_78;
  DynamicEnum local_70;
  DebugComparison<unsigned_int,_unsigned_long> local_60;
  
  local_70.schema = input.schema.super_Schema.raw;
  local_70.value = input.value;
  DynamicEnum::getEnumerant((Maybe<capnp::EnumSchema::Enumerant> *)&local_60,&local_70);
  pcVar2 = local_60.op.content.ptr;
  if ((char)local_60.left == '\x01') {
    uVar3 = (ulong)local_60.op.content.ptr & 0xffff;
    local_60.right = (this->valueToName).size_;
    local_60.left = (uint)(ushort)local_60.op.content.ptr;
    local_60.op.content.ptr = " < ";
    local_60.op.content.size_ = 4;
    local_60.result = uVar3 < local_60.right;
    if (local_60.right <= uVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long>&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x56b,FAILED,"e.getIndex() < valueToName.size()","_kjCondition,",&local_60);
      kj::_::Debug::Fault::fatal(&local_78);
    }
    pSVar1 = (this->valueToName).ptr;
    value.super_StringPtr.content.size_ = pSVar1[(ulong)pcVar2 & 0xffff].content.size_;
    value.super_StringPtr.content.ptr = pSVar1[(ulong)pcVar2 & 0xffff].content.ptr;
    capnp::json::Value::Builder::setString(&output,value);
  }
  else {
    *(undefined2 *)output._builder.data = 2;
    *(double *)((long)output._builder.data + 8) = (double)local_70.value;
  }
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_SOME(e, input.getEnumerant()) {
      KJ_ASSERT(e.getIndex() < valueToName.size());
      output.setString(valueToName[e.getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }